

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O0

void __thiscall sjtu::TrainManager::bitset_set(TrainManager *this,uint x,uint y,uint bit)

{
  _Ios_Openmode _Var1;
  int in_ECX;
  byte in_DL;
  uint bits;
  fstream bitset;
  streamoff in_stack_fffffffffffffd98;
  char *__off;
  fpos<__mbstate_t> *in_stack_fffffffffffffda0;
  undefined8 local_258;
  undefined8 local_240;
  undefined8 local_238;
  uint local_22c;
  char local_228 [16];
  char local_218 [516];
  int local_14;
  byte local_10;
  
  local_14 = in_ECX;
  local_10 = in_DL;
  _Var1 = std::operator|(_S_in,_S_out);
  _Var1 = std::operator|(_Var1,_S_bin);
  std::fstream::fstream(local_228,"Bitset.dat",_Var1);
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::istream::seekg(local_228,local_240,local_238);
  std::istream::read(local_228,(long)&local_22c);
  if (local_14 == 0) {
    local_22c = (1 << (local_10 & 0x1f) ^ 0xffffffffU) & local_22c;
  }
  else {
    local_22c = 1 << (local_10 & 0x1f) | local_22c;
  }
  __off = local_218;
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffffda0,(streamoff)__off);
  std::ostream::seekp(__off,in_stack_fffffffffffffda0,local_258);
  std::ostream::write(local_218,(long)&local_22c);
  std::fstream::close();
  std::fstream::~fstream(local_228);
  return;
}

Assistant:

void bitset_set(unsigned int x , unsigned int y , unsigned int bit = 1)
		{
			std::fstream bitset("Bitset.dat" , std::ios_base::in | std::ios_base::out | std::ios_base::binary);
			unsigned int bits;
			bitset.seekg((x * WS + y / W) * sizeof (int)) , bitset.read(reinterpret_cast<char *> (&bits) , sizeof (unsigned int));
			if (bit) bits |= 1 << y % W;
			else bits &= (~ 0) ^ (1 << y % W);
			bitset.seekp((x * WS + y / W) * sizeof (int)) , bitset.write(reinterpret_cast<char *> (&bits) , sizeof (unsigned int));
			bitset.close();
		}